

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O1

bool __thiscall mkvmuxer::VideoTrack::SetProjection(VideoTrack *this,Projection *projection)

{
  Projection *pPVar1;
  bool bVar2;
  Projection *this_00;
  
  this_00 = (Projection *)operator_new(0x20);
  this_00->type_ = kRectangular;
  this_00->pose_yaw_ = 0.0;
  this_00->pose_pitch_ = 0.0;
  this_00->pose_roll_ = 0.0;
  this_00->private_data_ = (uint8_t *)0x0;
  this_00->private_data_length_ = 0;
  if (projection->private_data_ != (uint8_t *)0x0) {
    bVar2 = Projection::SetProjectionPrivate
                      (this_00,projection->private_data_,projection->private_data_length_);
    if (!bVar2) {
      bVar2 = false;
      goto LAB_0011cbe5;
    }
  }
  this_00->type_ = projection->type_;
  this_00->pose_yaw_ = projection->pose_yaw_;
  this_00->pose_pitch_ = projection->pose_pitch_;
  this_00->pose_roll_ = projection->pose_roll_;
  pPVar1 = this->projection_;
  if (pPVar1 != (Projection *)0x0) {
    if (pPVar1->private_data_ != (uint8_t *)0x0) {
      operator_delete__(pPVar1->private_data_);
    }
    operator_delete(pPVar1);
  }
  this->projection_ = this_00;
  bVar2 = true;
  this_00 = (Projection *)0x0;
LAB_0011cbe5:
  if (this_00 != (Projection *)0x0) {
    if (this_00->private_data_ != (uint8_t *)0x0) {
      operator_delete__(this_00->private_data_);
    }
    operator_delete(this_00);
  }
  return bVar2;
}

Assistant:

bool VideoTrack::SetProjection(const Projection& projection) {
  std::unique_ptr<Projection> projection_ptr(new Projection());
  if (!projection_ptr.get())
    return false;

  if (projection.private_data()) {
    if (!projection_ptr->SetProjectionPrivate(
            projection.private_data(), projection.private_data_length())) {
      return false;
    }
  }

  projection_ptr->set_type(projection.type());
  projection_ptr->set_pose_yaw(projection.pose_yaw());
  projection_ptr->set_pose_pitch(projection.pose_pitch());
  projection_ptr->set_pose_roll(projection.pose_roll());
  delete projection_;
  projection_ = projection_ptr.release();
  return true;
}